

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O2

Sfm_Ntk_t * Gia_ManExtractMfs(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  Tim_Man_t *pTVar2;
  Gia_Man_t *pGVar3;
  byte bVar4;
  Vec_Int_t *vLeaves;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  word *pwVar11;
  Sfm_Ntk_t *pSVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char Entry;
  char extraout_DL;
  char Entry_00;
  char Entry_01;
  char Entry_02;
  char Entry_03;
  char Entry_04;
  char Entry_05;
  char Entry_06;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar16;
  undefined8 extraout_RDX_02;
  char *__assertion;
  int iVar17;
  int iVar18;
  Vec_Wrd_t *pVVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  int nBbIns;
  Vec_Int_t *local_130;
  uint local_124;
  ulong local_120;
  ulong local_118;
  int local_110;
  int nBbOuts;
  ulong local_108;
  ulong local_100;
  int local_f4;
  undefined8 local_f0;
  Vec_Wrd_t *local_e8;
  Vec_Wrd_t *local_e0;
  Vec_Str_t *local_d8;
  ulong local_d0;
  Vec_Wec_t *local_c8;
  word uTruth;
  ulong local_b8;
  ulong local_b0;
  Vec_Str_t *local_a8;
  Vec_Int_t *local_a0;
  Vec_Int_t *local_98;
  int local_90;
  int local_8c;
  Gia_Man_t *local_88;
  ulong local_80;
  Tim_Man_t *local_78;
  ulong local_70;
  ulong local_68 [7];
  
  local_68[0] = 0xaaaaaaaaaaaaaaaa;
  local_68[1] = 0xcccccccccccccccc;
  local_68[2] = 0xf0f0f0f0f0f0f0f0;
  local_68[3] = 0xff00ff00ff00ff00;
  local_68[4] = 0xffff0000ffff0000;
  local_68[5] = 0xffffffff00000000;
  pTVar2 = (Tim_Man_t *)p->pManTime;
  local_f4 = Gia_ManBoxNum(p);
  if (local_f4 == 0) {
    local_124 = p->vCis->nSize - p->nRegs;
    local_110 = p->vCos->nSize - p->nRegs;
  }
  else {
    local_124 = Tim_ManPiNum(pTVar2);
    local_110 = Tim_ManPoNum(pTVar2);
  }
  nBbIns = 0;
  nBbOuts = 0;
  iVar5 = Gia_ManLutSizeMax(p);
  iVar17 = 6;
  if (6 < iVar5) {
    iVar17 = iVar5;
  }
  if (0xf < iVar5) {
    __assertion = "nLutSizeMax < 16";
    uVar14 = 0x4a;
LAB_005fd0ad:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,uVar14,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  iVar18 = 0;
  iVar5 = 0;
  if (pTVar2 != (Tim_Man_t *)0x0) {
    Tim_ManBlackBoxIoNum(pTVar2,&nBbIns,&nBbOuts);
    iVar5 = nBbOuts;
  }
  uVar14 = p->vCis->nSize;
  local_78 = pTVar2;
  iVar6 = Gia_ManLutNum(p);
  local_f0 = CONCAT44(extraout_var,iVar6);
  uVar13 = uVar14 + iVar6;
  local_108 = (ulong)uVar13;
  uVar1 = p->vCos->nSize;
  local_b0 = (ulong)uVar1;
  local_b8 = (ulong)(uint)nBbIns;
  local_d0 = (ulong)(uint)nBbOuts;
  iVar6 = nBbOuts + nBbIns + uVar1 + uVar13 + 1;
  local_118 = (ulong)uVar14;
  local_c8 = Vec_WecStart(iVar6);
  local_d8 = Vec_StrStart(iVar6);
  local_a8 = Vec_StrStart(iVar6);
  local_e8 = Vec_WrdAlloc(iVar6);
  local_e8->nSize = iVar6;
  memset(local_e8->pArray,0,(long)iVar6 * 8);
  local_98 = Vec_IntStart(iVar6);
  local_e0 = Vec_WrdAlloc(10000);
  p_00 = &p->vCopies;
  Vec_IntFill(p_00,p->nObjs,-1);
  uVar16 = extraout_RDX;
  while( true ) {
    Entry = (char)uVar16;
    iVar6 = iVar18 + iVar5;
    if (p->vCis->nSize <= iVar18) break;
    pGVar8 = Gia_ManCi(p,iVar18);
    iVar7 = Gia_ObjId(p,pGVar8);
    Entry = extraout_DL;
    if (iVar7 == 0) break;
    Vec_IntWriteEntry(p_00,iVar7,iVar6);
    iVar18 = iVar18 + 1;
    uVar16 = extraout_RDX_00;
  }
  Vec_StrWriteEntry(local_d8,iVar6,Entry);
  Vec_WrdWriteEntry(local_e8,iVar6,0);
  uVar21 = (ulong)(iVar18 + iVar5 + 1);
  Vec_IntWriteEntry(p_00,0,iVar6);
  pVVar9 = Vec_IntAlloc(iVar17);
  Gia_ObjComputeTruthTableStart(p,iVar17);
  iVar17 = 1;
  local_130 = pVVar9;
  do {
    if (p->nObjs <= iVar17) {
      Gia_ObjComputeTruthTableStop(p);
      uVar15 = 0;
      local_120 = uVar21;
      while( true ) {
        iVar5 = (int)uVar15;
        iVar17 = (int)local_120;
        if ((p->vCos->nSize <= iVar5) || (pGVar8 = Gia_ManCo(p,iVar5), pGVar8 == (Gia_Obj_t *)0x0))
        break;
        local_100 = uVar15;
        iVar5 = Gia_ObjFaninId0p(p,pGVar8);
        iVar18 = Vec_IntEntry(p_00,iVar5);
        if (iVar18 < 0) {
          __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x89,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        iVar18 = (int)local_100;
        iVar17 = iVar17 + iVar18;
        local_a0 = Vec_WecEntry(local_c8,iVar17);
        iVar5 = Vec_IntEntry(p_00,iVar5);
        Vec_IntFill(local_a0,1,iVar5);
        if (iVar18 < p->vCos->nSize - local_110) {
          Vec_StrWriteEntry(local_d8,iVar17,Entry_02);
          Vec_StrWriteEntry(local_a8,iVar17,Entry_03);
          uTruth = (long)((*(int *)pGVar8 << 2) >> 0x1f) ^ 0xaaaaaaaaaaaaaaaa;
          Vec_WrdWriteEntry(local_e8,iVar17,uTruth);
        }
        iVar5 = Gia_ObjId(p,pGVar8);
        Vec_IntWriteEntry(p_00,iVar5,iVar17);
        uVar15 = (ulong)((int)local_100 + 1);
        pVVar9 = local_130;
      }
      pVVar19 = local_e0;
      iVar18 = (int)local_b8;
      if (((((int)local_f0 + (int)local_b0 + (int)local_118 + (int)local_d0 + iVar18) - iVar17) -
          nBbIns) + 1 != iVar5) {
        __assert_fail("Counter == nMfsVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                      ,0x97,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
      }
      pGVar3 = p->pAigExtra;
      if (pGVar3 != (Gia_Man_t *)0x0) {
        iVar17 = pGVar3->vCis->nSize;
        if (0xf < iVar17) {
          __assert_fail("Gia_ManCiNum(p->pAigExtra) < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x9c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        Gia_ObjComputeTruthTableStart(pGVar3,iVar17);
        if (local_f4 < 1) {
          local_f4 = 0;
        }
        local_80 = (ulong)((int)local_108 + (int)local_b0 + iVar18 + (int)local_d0 + 1);
        local_108 = local_108 & 0xffffffff00000000;
        local_100 = 0;
        local_a0 = (Vec_Int_t *)0x0;
        iVar17 = 0;
        local_88 = p;
        uVar14 = local_124;
        while (pTVar2 = local_78, local_118 = (ulong)uVar14, iVar17 != local_f4) {
          iVar5 = Tim_ManBoxInputNum(local_78,iVar17);
          local_f0 = CONCAT44(local_f0._4_4_,iVar5);
          iVar5 = Tim_ManBoxOutputNum(pTVar2,iVar17);
          local_90 = iVar17;
          iVar17 = Tim_ManBoxIsBlack(pTVar2,iVar17);
          local_120 = CONCAT44(local_120._4_4_,iVar5);
          if (iVar17 == 0) {
            pVVar9->nSize = 0;
            iVar5 = 0;
            iVar17 = 0;
            if (0 < (int)local_f0) {
              iVar17 = (int)local_f0;
            }
            local_b8 = CONCAT44(local_b8._4_4_,iVar17);
            for (; iVar17 != iVar5; iVar5 = iVar5 + 1) {
              pGVar3 = p->pAigExtra;
              pGVar8 = Gia_ManCi(pGVar3,iVar5);
              iVar17 = (int)local_b8;
              iVar18 = Gia_ObjId(pGVar3,pGVar8);
              Vec_IntPush(pVVar9,iVar18);
            }
            local_70 = (ulong)((int)local_118 - local_124);
            uVar21 = 0;
            local_8c = 0;
            iVar17 = (int)local_120;
            if (0 < (int)local_120) {
              local_8c = (int)local_120;
            }
            while( true ) {
              iVar5 = (int)local_f0;
              if ((int)uVar21 == local_8c) break;
              local_b0 = uVar21;
              pGVar8 = Gia_ManCi(p,(int)uVar21 + (int)local_118);
              iVar17 = Gia_ObjId(p,pGVar8);
              iVar17 = Vec_IntEntry(p_00,iVar17);
              local_d0 = CONCAT44(local_d0._4_4_,iVar17);
              pVVar9 = Vec_WecEntry(local_c8,iVar17);
              Vec_IntGrow(pVVar9,iVar5);
              uVar16 = extraout_RDX_01;
              iVar17 = (int)local_108;
              iVar5 = (int)local_b8;
              while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
                pGVar8 = Gia_ManCo(p,iVar17);
                iVar18 = Gia_ObjId(p,pGVar8);
                iVar6 = Vec_IntEntry(p_00,iVar18);
                if (iVar6 < 0) {
                  __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                                ,0xb6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
                }
                iVar18 = Vec_IntEntry(p_00,iVar18);
                Vec_IntPush(pVVar9,iVar18);
                iVar17 = iVar17 + 1;
                uVar16 = extraout_RDX_02;
              }
              Vec_StrWriteEntry(local_d8,(int)local_d0,(char)uVar16);
              pGVar8 = Gia_ManCo(p->pAigExtra,(int)local_70 + (int)local_b0);
              iVar17 = Gia_ObjFaninId0p(p->pAigExtra,pGVar8);
              pVVar19 = local_e0;
              if (iVar17 == 0) {
                uTruth = (word)((*(int *)pGVar8 << 2) >> 0x1f);
                pwVar11 = &uTruth;
              }
              else {
                uVar21 = (ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff);
                if (((uint)*(undefined8 *)(pGVar8 + -uVar21) & 0x9fffffff) == 0x9fffffff) {
                  uTruth = (long)((*(int *)pGVar8 << 2) >> 0x1f) ^
                           *(ulong *)((long)local_68 +
                                     (ulong)(uint)((int)((ulong)*(undefined8 *)(pGVar8 + -uVar21) >>
                                                        0x20) << 3));
                  pwVar11 = &uTruth;
                }
                else {
                  pwVar11 = Gia_ObjComputeTruthTableCut(p->pAigExtra,pGVar8 + -uVar21,local_130);
                  if ((pGVar8->field_0x3 & 0x20) != 0) {
                    bVar4 = (char)local_130->nSize - 6U & 0x1f;
                    uVar21 = (ulong)(uint)(1 << bVar4);
                    if (1 << bVar4 < 1) {
                      uVar21 = 0;
                    }
                    if (local_130->nSize < 7) {
                      uVar21 = 1;
                    }
                    for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
                      pwVar11[uVar15] = ~pwVar11[uVar15];
                    }
                  }
                }
              }
              iVar17 = Abc_TtMinBase(pwVar11,pVVar9->pArray,pVVar9->nSize,local_130->nSize);
              Vec_IntShrink(pVVar9,iVar17);
              if (iVar17 < 7) {
                Vec_WrdWriteEntry(local_e8,(int)local_d0,*pwVar11);
              }
              else {
                bVar4 = (char)iVar17 - 6U & 0x1f;
                Vec_IntWriteEntry(local_98,(int)local_d0,pVVar19->nSize);
                uVar14 = 1 << bVar4;
                if (1 << bVar4 < 1) {
                  uVar14 = 0;
                }
                for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
                  Vec_WrdPush(pVVar19,pwVar11[uVar21]);
                }
              }
              uVar21 = (ulong)((int)local_b0 + 1);
              pVVar9 = local_130;
              iVar17 = (int)local_120;
            }
            iVar5 = (int)local_b8;
          }
          else {
            iVar17 = 0;
            if (0 < iVar5) {
              iVar17 = iVar5;
            }
            uVar21 = local_118 & 0xffffffff;
            while (bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
              pGVar8 = Gia_ManCi(p,(int)uVar21);
              iVar5 = Gia_ObjId(p,pGVar8);
              iVar5 = Vec_IntEntry(p_00,iVar5);
              pVVar9 = Vec_WecEntry(local_c8,iVar5);
              if (pVVar9->nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xe9,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              iVar18 = (int)local_a0;
              Vec_IntFill(pVVar9,1,iVar18);
              Vec_StrWriteEntry(local_d8,iVar5,Entry_04);
              Vec_StrWriteEntry(local_a8,iVar5,Entry_05);
              Vec_WrdWriteEntry(local_e8,iVar5,0xaaaaaaaaaaaaaaaa);
              uVar21 = (ulong)((int)uVar21 + 1);
              local_a0 = (Vec_Int_t *)(ulong)(iVar18 + 1);
            }
            iVar5 = 0;
            if (0 < (int)local_f0) {
              iVar5 = (int)local_f0;
            }
            iVar6 = (int)local_80 + (int)local_100;
            iVar18 = (int)local_108;
            iVar17 = iVar5;
            while (pGVar3 = local_88, bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
              pGVar8 = Gia_ManCo(local_88,iVar18);
              iVar7 = Gia_ObjId(pGVar3,pGVar8);
              iVar7 = Vec_IntEntry(p_00,iVar7);
              pVVar9 = Vec_WecEntry(local_c8,iVar6 - nBbIns);
              if (pVVar9->nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xf6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              local_100 = (ulong)((int)local_100 + 1);
              Vec_IntFill(pVVar9,1,iVar7);
              iVar18 = iVar18 + 1;
              iVar6 = iVar6 + 1;
            }
            p = local_88;
            pVVar9 = local_130;
            iVar17 = (int)local_120;
          }
          iVar18 = (int)local_108;
          while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
            pGVar8 = Gia_ManCo(p,iVar18);
            if (((undefined1  [12])pGVar8[-(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)] &
                (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) {
              iVar17 = Gia_ObjFaninId0p(p,pGVar8);
              iVar17 = Vec_IntEntry(p_00,iVar17);
              Vec_StrWriteEntry(local_a8,iVar17,Entry_06);
            }
            iVar18 = iVar18 + 1;
            iVar17 = (int)local_120;
          }
          local_108 = CONCAT44(local_108._4_4_,(int)local_108 + (int)local_f0);
          uVar14 = iVar17 + (int)local_118;
          pVVar19 = local_e0;
          iVar17 = local_90 + 1;
        }
        Gia_ObjComputeTruthTableStop(p->pAigExtra);
        if ((int)local_118 != p->vCis->nSize) {
          __assert_fail("curCi == Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x109,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if ((int)local_108 + local_110 != p->vCos->nSize) {
          __assert_fail("curCo == Gia_ManCoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x10a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if ((int)local_118 - local_124 != p->pAigExtra->vCos->nSize) {
          __assert_fail("curCi - nRealPis == Gia_ManCoNum(p->pAigExtra)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x10b,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if ((int)local_100 != nBbIns) {
          __assert_fail("iBbIn == nBbIns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x10c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if ((int)local_a0 != nBbOuts) {
          __assert_fail("iBbOut == nBbOuts",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x10d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
      }
      Vec_IntFree(pVVar9);
      pSVar12 = Sfm_NtkConstruct(local_c8,local_124 + nBbOuts,local_110 + nBbIns,local_d8,local_a8,
                                 local_e8,local_98,pVVar19);
      return pSVar12;
    }
    iVar5 = Vec_IntEntry(p->vMapping,iVar17);
    if (iVar5 != 0) {
      pVVar9->nSize = 0;
      local_120 = uVar21;
      pVVar9 = Vec_WecEntry(local_c8,(int)uVar21);
      iVar5 = Gia_ObjLutSize(p,iVar17);
      Vec_IntGrow(pVVar9,iVar5);
      for (lVar20 = 0; iVar5 = Gia_ObjLutSize(p,iVar17), vLeaves = local_130, lVar20 < iVar5;
          lVar20 = lVar20 + 1) {
        piVar10 = Gia_ObjLutFanins(p,iVar17);
        iVar5 = piVar10[lVar20];
        iVar18 = Vec_IntEntry(p_00,iVar5);
        if (iVar18 < 0) {
          __assertion = "Gia_ObjCopyArray(p, iFan) >= 0";
          uVar14 = 0x69;
          goto LAB_005fd0ad;
        }
        iVar18 = Vec_IntEntry(p_00,iVar5);
        Vec_IntPush(pVVar9,iVar18);
        Vec_IntPush(local_130,iVar5);
      }
      iVar5 = local_130->nSize;
      if (0xf < iVar5) {
        __assertion = "Vec_IntSize(vLeaves) < 16";
        uVar14 = 0x6d;
        goto LAB_005fd0ad;
      }
      iVar18 = Gia_ObjLutSize(p,iVar17);
      if (iVar5 != iVar18) {
        __assertion = "Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id)";
        uVar14 = 0x6e;
        goto LAB_005fd0ad;
      }
      pGVar8 = Gia_ManObj(p,iVar17);
      pwVar11 = Gia_ObjComputeTruthTableCut(p,pGVar8,vLeaves);
      iVar5 = Abc_TtMinBase(pwVar11,pVVar9->pArray,pVVar9->nSize,vLeaves->nSize);
      Vec_IntShrink(pVVar9,iVar5);
      if (iVar5 < 7) {
        Vec_WrdWriteEntry(local_e8,(int)local_120,*pwVar11);
      }
      else {
        bVar4 = (char)iVar5 - 6U & 0x1f;
        Vec_IntWriteEntry(local_98,(int)local_120,local_e0->nSize);
        uVar14 = 1 << bVar4;
        if (1 << bVar4 < 1) {
          uVar14 = 0;
        }
        for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
          Vec_WrdPush(local_e0,pwVar11[uVar21]);
        }
      }
      iVar5 = Gia_ObjLutIsMux(p,iVar17);
      iVar18 = (int)local_120;
      if (iVar5 != 0) {
        Vec_StrWriteEntry(local_d8,iVar18,Entry_00);
        Vec_StrWriteEntry(local_a8,iVar18,Entry_01);
      }
      uVar21 = (ulong)(iVar18 + 1);
      Vec_IntWriteEntry(p_00,iVar17,iVar18);
      pVVar9 = local_130;
    }
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sfm_Ntk_t * Gia_ManExtractMfs( Gia_Man_t * p )
{
    word uTruth, * pTruth, uTruths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Gia_Obj_t * pObj, * pObjExtra;
    Vec_Wec_t * vFanins; // mfs data
    Vec_Str_t * vFixed;  // mfs data 
    Vec_Str_t * vEmpty;  // mfs data
    Vec_Wrd_t * vTruths; // mfs data
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Vec_Int_t * vLeaves;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes   = Gia_ManBoxNum(p), nVars;
    int nRealPis = nBoxes ? Tim_ManPiNum(pManTime) : Gia_ManPiNum(p);
    int nRealPos = nBoxes ? Tim_ManPoNum(pManTime) : Gia_ManPoNum(p);
    int i, j, k, curCi, curCo, nBoxIns, nBoxOuts;
    int Id, iFan, nMfsVars, nBbIns = 0, nBbOuts = 0, Counter = 0;
    int nLutSizeMax = Gia_ManLutSizeMax( p );
    nLutSizeMax = Abc_MaxInt( nLutSizeMax, 6 );
    assert( nLutSizeMax < 16 );
    //assert( !p->pAigExtra || Gia_ManPiNum(p->pAigExtra) <= 6 );
    if ( pManTime ) Tim_ManBlackBoxIoNum( pManTime, &nBbIns, &nBbOuts );
    // skip PIs due to box outputs
    Counter += nBbOuts;
    // prepare storage
    nMfsVars = Gia_ManCiNum(p) + 1 + Gia_ManLutNum(p) + Gia_ManCoNum(p) + nBbIns + nBbOuts;
    vFanins  = Vec_WecStart( nMfsVars );
    vFixed   = Vec_StrStart( nMfsVars );
    vEmpty   = Vec_StrStart( nMfsVars );
    vTruths  = Vec_WrdStart( nMfsVars );
    vStarts  = Vec_IntStart( nMfsVars );
    vTruths2 = Vec_WrdAlloc( 10000 );
    // set internal PIs
    Gia_ManCleanCopyArray( p );
    Gia_ManForEachCiId( p, Id, i )
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    // set constant node
    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
    Vec_WrdWriteEntry( vTruths, Counter, (word)0 );
    Gia_ObjSetCopyArray( p, 0, Counter++ );
    // set internal LUTs
    vLeaves = Vec_IntAlloc( nLutSizeMax );
    Gia_ObjComputeTruthTableStart( p, nLutSizeMax );
    Gia_ManForEachLut( p, Id )
    {
        Vec_IntClear( vLeaves );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntGrow( vArray, Gia_ObjLutSize(p, Id) );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            assert( Gia_ObjCopyArray(p, iFan) >= 0 );
            Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
            Vec_IntPush( vLeaves, iFan );
        }
        assert( Vec_IntSize(vLeaves) < 16 );
        assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id) );
//        uTruth = *Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
//        nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
        nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
        Vec_IntShrink( vArray, nVars );
        if ( nVars <= 6 )
            Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
        else
        {
            int w, nWords = Abc_Truth6WordNum( nVars );
            Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
            for ( w = 0; w < nWords; w++ )
                Vec_WrdPush( vTruths2, pTruth[w] );
        }
        if ( Gia_ObjLutIsMux(p, Id) )
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
        }
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    }
    Gia_ObjComputeTruthTableStop( p );
    // set all POs
    Gia_ManForEachCo( p, pObj, i )
    {
        iFan = Gia_ObjFaninId0p( p, pObj );
        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntFill( vArray, 1, Gia_ObjCopyArray(p, iFan) );
        if ( i < Gia_ManCoNum(p) - nRealPos ) // internal PO
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            uTruth = Gia_ObjFaninC0(pObj) ? ~uTruths6[0]: uTruths6[0];
            Vec_WrdWriteEntry( vTruths, Counter, uTruth );
        }
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Counter++ );
    }
    // skip POs due to box inputs
    Counter += nBbIns;
    assert( Counter == nMfsVars );
    // add functions of the boxes
    if ( p->pAigExtra )
    {
        int iBbIn = 0, iBbOut = 0;
        assert( Gia_ManCiNum(p->pAigExtra) < 16 );
        Gia_ObjComputeTruthTableStart( p->pAigExtra, Gia_ManCiNum(p->pAigExtra) );
        curCi = nRealPis;
        curCo = 0;
        for ( k = 0; k < nBoxes; k++ )
        {
            nBoxIns = Tim_ManBoxInputNum( pManTime, k );
            nBoxOuts = Tim_ManBoxOutputNum( pManTime, k );
            // iterate through box outputs
            if ( !Tim_ManBoxIsBlack(pManTime, k) ) //&& Tim_ManBoxInputNum(pManTime, k) <= 6 )
            {
                // collect truth table leaves
                Vec_IntClear( vLeaves );
                for ( i = 0; i < nBoxIns; i++ )
                    Vec_IntPush( vLeaves, Gia_ObjId(p->pAigExtra, Gia_ManCi(p->pAigExtra, i)) );
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // add box inputs (POs of the AIG) as fanins
                    vArray = Vec_WecEntry( vFanins, Counter );
                    Vec_IntGrow( vArray, nBoxIns );
                    for ( i = 0; i < nBoxIns; i++ )
                    {
                        iFan = Gia_ObjId( p, Gia_ManCo(p, curCo + i) );
                        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
                        Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
                    }
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    // box output in the extra manager
                    pObjExtra = Gia_ManCo( p->pAigExtra, curCi - nRealPis + j );
                    // compute truth table
                    pTruth = NULL;
                    if ( Gia_ObjFaninId0p(p->pAigExtra, pObjExtra) == 0 )
                    {
                        uTruth = 0;
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else if ( Gia_ObjIsCi(Gia_ObjFanin0(pObjExtra)) )
                    {
                        uTruth = uTruths6[Gia_ObjCioId(Gia_ObjFanin0(pObjExtra))];
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else
                    {
                        pTruth = Gia_ObjComputeTruthTableCut( p->pAigExtra, Gia_ObjFanin0(pObjExtra), vLeaves );
                        if ( Gia_ObjFaninC0(pObjExtra) )
                            Abc_TtNot( pTruth, Abc_Truth6WordNum(Vec_IntSize(vLeaves)) );
                    }
                    //uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                    //Dau_DsdPrintFromTruth( &uTruth, Vec_IntSize(vArray) );
                    //nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
                    nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
                    Vec_IntShrink( vArray, nVars );
                    if ( nVars <= 6 )
                        Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
                    else
                    {
                        int w, nWords = Abc_Truth6WordNum( nVars );
                        Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
                        for ( w = 0; w < nWords; w++ )
                            Vec_WrdPush( vTruths2, pTruth[w] );
                    }
                }
            }
            else // create buffers for black box inputs and outputs
            {
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary input (iBbOut)
                    vArray = Vec_WecEntry( vFanins, Counter );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, iBbOut++ );
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
                    Vec_WrdWriteEntry( vTruths, Counter, uTruths6[0] );
                }
                for ( i = 0; i < nBoxIns; i++ )
                {
                    // CO corresponding to the box inputs
                    pObj = Gia_ManCo( p, curCo + i );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary output (iBbIn)
                    vArray = Vec_WecEntry( vFanins, nMfsVars - nBbIns + iBbIn++ );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, Counter );
                }
            }
            // set internal POs pointing directly to internal PIs as no-delay
            for ( i = 0; i < nBoxIns; i++ )
            {
                pObj = Gia_ManCo( p, curCo + i );
                if ( !Gia_ObjIsCi( Gia_ObjFanin0(pObj) ) )
                    continue;
                Counter = Gia_ObjCopyArray( p, Gia_ObjFaninId0p(p, pObj) );
                Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            }
            curCo += nBoxIns;
            curCi += nBoxOuts;
        }
        curCo += nRealPos;
        Gia_ObjComputeTruthTableStop( p->pAigExtra );
        // verify counts
        assert( curCi == Gia_ManCiNum(p) );
        assert( curCo == Gia_ManCoNum(p) );
        assert( curCi - nRealPis == Gia_ManCoNum(p->pAigExtra) );
        assert( iBbIn  == nBbIns );
        assert( iBbOut == nBbOuts );
    }
    // finalize 
    Vec_IntFree( vLeaves );
    return Sfm_NtkConstruct( vFanins, nBbOuts + nRealPis, nRealPos + nBbIns, vFixed, vEmpty, vTruths, vStarts, vTruths2 );
}